

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_table_find_strong_points
               (PSH_Hint_Table table,PSH_Point_conflict point,FT_UInt count,FT_Int threshold,
               PSH_Dir major_dir)

{
  PSH_Hint_conflict *ppPVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  FT_UInt min_flag;
  long lVar7;
  FT_UInt nn;
  PSH_Dir PVar8;
  ulong uVar9;
  PSH_Hint_conflict pPVar10;
  uint uVar11;
  bool bVar12;
  
  ppPVar1 = table->sort;
  uVar5 = (ulong)table->num_hints;
  lVar3 = (long)threshold;
  lVar6 = -lVar3;
  do {
    bVar12 = count == 0;
    count = count - 1;
    if (bVar12) {
      return;
    }
    uVar4 = point->flags2;
    if ((uVar4 & 0x10) == 0) {
      lVar2 = point->org_u;
      PVar8 = (point->dir_out | point->dir_in) & major_dir;
      if ((PVar8 & (PSH_DIR_RIGHT|PSH_DIR_DOWN)) == PSH_DIR_NONE) {
        if ((PVar8 & (PSH_DIR_LEFT|PSH_DIR_UP)) == PSH_DIR_NONE) {
          if ((uVar4 & 0x40) == 0) goto LAB_001fbe83;
          if ((uVar4 & (uint)(major_dir != PSH_DIR_HORIZONTAL) * 0x80 + 0x80) == 0) {
            if ((uVar4 & (uint)(major_dir == PSH_DIR_HORIZONTAL) * 0x80 + 0x80) != 0) {
              uVar9 = 0;
              do {
                if (uVar5 == uVar9) goto LAB_001fbf15;
                pPVar10 = ppPVar1[uVar9];
                lVar7 = lVar2 - ((long)pPVar10->org_len + (long)pPVar10->org_pos);
                uVar9 = uVar9 + 1;
              } while ((lVar7 == lVar6 || SBORROW8(lVar7,lVar6) != lVar7 + lVar3 < 0) ||
                       lVar3 <= lVar7);
              uVar11 = 0x410;
              goto LAB_001fbf0b;
            }
          }
          else {
            uVar9 = 0;
            do {
              if (uVar5 == uVar9) goto LAB_001fbf15;
              pPVar10 = ppPVar1[uVar9];
              lVar7 = lVar2 - pPVar10->org_pos;
              uVar9 = uVar9 + 1;
            } while (lVar3 <= lVar7 ||
                     (lVar7 == lVar6 || SBORROW8(lVar7,lVar6) != lVar7 + lVar3 < 0));
            uVar11 = 0x210;
LAB_001fbf0b:
            point->hint = pPVar10;
            point->flags2 = uVar4 | uVar11;
          }
LAB_001fbf15:
          if (point->hint == (PSH_Hint_conflict)0x0) {
            for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
              pPVar10 = ppPVar1[uVar9];
              if ((pPVar10->org_pos <= lVar2) && (lVar2 <= pPVar10->org_pos + pPVar10->org_len))
              goto LAB_001fbe7f;
            }
          }
          goto LAB_001fbe83;
        }
        uVar9 = 0;
        do {
          if (uVar5 == uVar9) goto LAB_001fbe83;
          pPVar10 = ppPVar1[uVar9];
          lVar7 = lVar2 - ((long)pPVar10->org_len + (long)pPVar10->org_pos);
          uVar9 = uVar9 + 1;
        } while ((lVar7 == lVar6 || SBORROW8(lVar7,lVar6) != lVar7 + lVar3 < 0) || lVar3 <= lVar7);
        uVar4 = uVar4 | 0x410;
      }
      else {
        uVar9 = 0;
        do {
          if (uVar5 == uVar9) goto LAB_001fbe83;
          pPVar10 = ppPVar1[uVar9];
          lVar7 = lVar2 - pPVar10->org_pos;
          uVar9 = uVar9 + 1;
        } while ((lVar7 == lVar6 || SBORROW8(lVar7,lVar6) != lVar7 + lVar3 < 0) || lVar3 <= lVar7);
        uVar4 = uVar4 | 0x210;
      }
      point->flags2 = uVar4;
LAB_001fbe7f:
      point->hint = pPVar10;
    }
LAB_001fbe83:
    point = point + 1;
  } while( true );
}

Assistant:

static void
  psh_hint_table_find_strong_points( PSH_Hint_Table  table,
                                     PSH_Point       point,
                                     FT_UInt         count,
                                     FT_Int          threshold,
                                     PSH_Dir         major_dir )
  {
    PSH_Hint*  sort      = table->sort;
    FT_UInt    num_hints = table->num_hints;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Dir  point_dir;
      FT_Pos   org_u = point->org_u;


      if ( psh_point_is_strong( point ) )
        continue;

      point_dir =
        (PSH_Dir)( ( point->dir_in | point->dir_out ) & major_dir );

      if ( point_dir & ( PSH_DIR_DOWN | PSH_DIR_RIGHT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MIN;
            point->hint    = hint;
            break;
          }
        }
      }
      else if ( point_dir & ( PSH_DIR_UP | PSH_DIR_LEFT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MAX;
            point->hint    = hint;
            break;
          }
        }
      }

#if 1
      else if ( psh_point_is_extremum( point ) )
      {
        /* treat extrema as special cases for stem edge alignment */
        FT_UInt  nn, min_flag, max_flag;


        if ( major_dir == PSH_DIR_HORIZONTAL )
        {
          min_flag = PSH_POINT_POSITIVE;
          max_flag = PSH_POINT_NEGATIVE;
        }
        else
        {
          min_flag = PSH_POINT_NEGATIVE;
          max_flag = PSH_POINT_POSITIVE;
        }

        if ( point->flags2 & min_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MIN;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }
        else if ( point->flags2 & max_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MAX;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }

        if ( !point->hint )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];


            if ( org_u >=          hint->org_pos                  &&
                 org_u <= ADD_INT( hint->org_pos, hint->org_len ) )
            {
              point->hint = hint;
              break;
            }
          }
        }
      }

#endif /* 1 */
    }
  }